

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  Graph *this;
  invalid_argument *this_00;
  char *pcVar3;
  int num_of_vert;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Give the number of vertices between 1..50: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::istream::operator>>((istream *)&std::cin,&num_of_vert);
  if (*(int *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18)) == 0) {
    if (0xffffffcd < num_of_vert - 0x33U) {
      this = (Graph *)operator_new(0x3528);
      Graph::Graph(this,5);
      Graph::loadGraph(this);
      Graph::printList(this);
      Graph::printPredList(this);
      Graph::isAdjoint(this);
      Graph::isLine(this);
      bVar1 = Graph::getAdjointStatus(this);
      pcVar3 = "Graph is not adjoint;";
      if (bVar1) {
        pcVar3 = "Graph is adjoint;";
      }
      poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar1 = Graph::getLineStatus(this);
      pcVar3 = "Graph is not line graph;";
      if (bVar1) {
        pcVar3 = "Graph is line graph;";
      }
      poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      Graph::transformToOriginal(this);
      Graph::saveOriginalGraph(this);
      return 0;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Too low/too high number ");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"You can pass only integer type");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int main(){
   int num_of_vert;
   cout << "Give the number of vertices between 1..50: " << endl;
   try{
      cin >> num_of_vert;
      if(not(cin.good()))
         throw invalid_argument("You can pass only integer type");
      if(num_of_vert < 1 or num_of_vert > 50)
         throw invalid_argument("Too low/too high number ");

   } catch(exception &e){
      cerr << e.what();
      exit(EXIT_FAILURE);
   }

   auto *G = new Graph();
   G->loadGraph();
   G->printList();
   G->printPredList();
   G->isAdjoint();
   G->isLine();
   if(G->getAdjointStatus())
      cout<<"Graph is adjoint;"<<endl;
   else
      cout<<"Graph is not adjoint;"<<endl;
   if(G->getLineStatus())
      cout<<"Graph is line graph;"<<endl;
   else
      cout<<"Graph is not line graph;"<<endl;;
   G->transformToOriginal();
   G->saveOriginalGraph();

   return 0;
}